

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O2

int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t inl)

{
  RC2_KEY *ks;
  
  ks = (RC2_KEY *)((long)ctx->cipher_data + 4);
  for (; 0xffff < inl; inl = inl - 0x10000) {
    RC2_cbc_encrypt(in,out,0x10000,ks,ctx->iv,ctx->encrypt);
    in = in + 0x10000;
    out = out + 0x10000;
  }
  if (inl != 0) {
    RC2_cbc_encrypt(in,out,inl,ks,ctx->iv,ctx->encrypt);
  }
  return 1;
}

Assistant:

static int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                          size_t inl) {
  EVP_RC2_KEY *key = (EVP_RC2_KEY *)ctx->cipher_data;
  static const size_t kChunkSize = 0x10000;

  while (inl >= kChunkSize) {
    RC2_cbc_encrypt(in, out, kChunkSize, &key->ks, ctx->iv, ctx->encrypt);
    inl -= kChunkSize;
    in += kChunkSize;
    out += kChunkSize;
  }
  if (inl) {
    RC2_cbc_encrypt(in, out, inl, &key->ks, ctx->iv, ctx->encrypt);
  }
  return 1;
}